

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

PFN_vkVoidFunction VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance,char *pName)

{
  void *key;
  VkInstance pVVar1;
  PFN_vkVoidFunction wrapped_proc_1;
  PFN_vkVoidFunction wrapped_proc;
  lock_guard<std::mutex> holder;
  Instance *layer;
  PFN_vkVoidFunction proc;
  char *pName_local;
  VkInstance instance_local;
  
  if (pName == (char *)0x0) {
    instance_local = (VkInstance)0x0;
  }
  else {
    instance_local = (VkInstance)Fossilize::interceptCoreInstanceCommand(pName);
    if (instance_local == (VkInstance)0x0) {
      if (instance == (VkInstance)0x0) {
        instance_local = (VkInstance)0x0;
      }
      else {
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)&wrapped_proc,(mutex_type *)Fossilize::globalLock);
        key = Fossilize::getDispatchKey(instance);
        holder._M_device =
             (mutex_type *)
             Fossilize::getLayerData<Fossilize::Instance>
                       (key,(unordered_map<void_*,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>_>
                             *)Fossilize::instanceData);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&wrapped_proc);
        pVVar1 = (VkInstance)Fossilize::Instance::getProcAddr((Instance *)holder._M_device,pName);
        if (((pVVar1 == (VkInstance)0x0) ||
            (instance_local = (VkInstance)Fossilize::interceptInstanceCommand(pName),
            instance_local == (VkInstance)0x0)) &&
           ((pVVar1 == (VkInstance)0x0 ||
            (instance_local =
                  (VkInstance)Fossilize::interceptDeviceCommand((Instance *)holder._M_device,pName),
            instance_local == (VkInstance)0x0)))) {
          instance_local = pVVar1;
        }
      }
    }
  }
  return (PFN_vkVoidFunction)instance_local;
}

Assistant:

VK_LAYER_EXPORT VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance, const char *pName)
{
	if (!pName)
		return nullptr;

	// We only wrap core Vulkan 1.0 instance commands, no need to check for availability of underlying implementation.
	auto proc = interceptCoreInstanceCommand(pName);
	if (proc)
		return proc;

	// For global instance functions, the assumption is that we cannot call down the chain.
	if (!instance)
		return nullptr;

	Instance *layer;
	{
		lock_guard<mutex> holder{globalLock};
		layer = getLayerData(getDispatchKey(instance), instanceData);
	}

	proc = layer->getProcAddr(pName);

	if (proc)
	{
		auto wrapped_proc = interceptInstanceCommand(pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	// If the underlying implementation returns nullptr, we also need to return nullptr.
	// This means we never expose wrappers which will end up dispatching into nullptr.
	if (proc)
	{
		auto wrapped_proc = interceptDeviceCommand(layer, pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	return proc;
}